

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

void __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<4>::rehash
          (InnerLeaf<4> *this,int hashPos)

{
  array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL> *paVar1;
  HighsHashTableEntry<int,_HighsImplications::VarBound> *pHVar2;
  HighsHashTableEntry<int,_HighsImplications::VarBound> *pHVar3;
  unsigned_long uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined4 uVar8;
  int iVar9;
  undefined4 uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL> *paVar17;
  uint64_t hash;
  ulong uVar18;
  ulong uVar19;
  int pos;
  int i;
  type entry;
  int local_50;
  int local_4c;
  undefined8 local_48;
  double dStack_40;
  double local_38;
  
  (this->occupation).occupation = 0;
  uVar14 = this->size;
  paVar1 = &this->entries;
  uVar12 = 0;
  uVar16 = 0;
  if (0 < (int)uVar14) {
    uVar16 = (ulong)uVar14;
  }
  uVar18 = 0;
  paVar17 = paVar1;
  for (; uVar16 != uVar12; uVar12 = uVar12 + 1) {
    uVar19 = (ulong)(uint)paVar17->_M_elems[0].key_;
    uVar19 = (uVar19 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
             uVar19 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32) >>
             ((char)hashPos * -6 + 0x30U & 0x3f);
    (this->hashes)._M_elems[uVar12] = uVar19 & 0xffff;
    uVar18 = uVar18 | 1L << (uVar19 >> 10 & 0x3f);
    (this->occupation).occupation = uVar18;
    paVar17 = (array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL> *)
              (paVar17->_M_elems + 1);
  }
  local_4c = 0;
  iVar11 = 0;
  do {
    if ((int)uVar14 <= iVar11) {
      return;
    }
    lVar15 = (long)iVar11;
    uVar12 = (this->hashes)._M_elems[lVar15];
    lVar13 = POPCOUNT((this->occupation).occupation >> ((byte)(uVar12 >> 10) & 0x3f));
    local_50 = (int)lVar13 + -1;
    if (iVar11 < local_50) {
      uVar4 = (this->hashes)._M_elems[local_50];
      (this->hashes)._M_elems[local_50] = uVar12;
      (this->hashes)._M_elems[lVar15] = uVar4;
      dVar5 = (this->entries)._M_elems[local_50].value_.constant;
      pHVar2 = paVar1->_M_elems + local_50;
      iVar9 = pHVar2->key_;
      uVar10 = *(undefined4 *)&pHVar2->field_0x4;
      dVar6 = (pHVar2->value_).coef;
      (this->entries)._M_elems[local_50].value_.constant =
           (this->entries)._M_elems[lVar15].value_.constant;
      pHVar2 = paVar1->_M_elems + lVar15;
      uVar8 = *(undefined4 *)&pHVar2->field_0x4;
      dVar7 = (pHVar2->value_).coef;
      pHVar3 = paVar1->_M_elems + local_50;
      pHVar3->key_ = pHVar2->key_;
      *(undefined4 *)&pHVar3->field_0x4 = uVar8;
      (pHVar3->value_).coef = dVar7;
      (this->entries)._M_elems[lVar15].value_.constant = dVar5;
      pHVar2 = paVar1->_M_elems + lVar15;
      pHVar2->key_ = iVar9;
      *(undefined4 *)&pHVar2->field_0x4 = uVar10;
      (pHVar2->value_).coef = dVar6;
    }
    else {
      for (; lVar13 + -1 < lVar15; lVar13 = lVar13 + 1) {
        if ((this->hashes)._M_elems[lVar13 + -1] < uVar12) {
          local_38 = (this->entries)._M_elems[lVar15].value_.constant;
          local_48 = *(undefined8 *)(paVar1->_M_elems + lVar15);
          dStack_40 = paVar1->_M_elems[lVar15].value_.coef;
          move_backward(this,&local_50,&local_4c);
          lVar13 = (long)local_50;
          (this->hashes)._M_elems[lVar13] = uVar12;
          (this->entries)._M_elems[lVar13].value_.constant = local_38;
          *(undefined8 *)(paVar1->_M_elems + lVar13) = local_48;
          paVar1->_M_elems[lVar13].value_.coef = dStack_40;
          iVar11 = local_4c;
          break;
        }
        local_50 = (int)lVar13;
      }
      iVar11 = iVar11 + 1;
      local_4c = iVar11;
    }
    uVar14 = this->size;
  } while( true );
}

Assistant:

void rehash(int hashPos) {
      // function needs to possibly reorder elements by a different hash value
      // chances are very high we are already ordered correctly as we use 16
      // bits of the hash and one level is uses 6 bits, so the new values
      // are guaranteed to be ordered correctly by their 10 most significant
      // bits if increasing the hash position by 1 and only if the 10 bits of
      // the hash had a collision the new 6 bits might break a tie differently.
      // It is, however, important to maintain the exact ordering as otherwise
      // elements may not be found.
      occupation = 0;
      for (int i = 0; i < size; ++i) {
        hashes[i] = get_hash_chunks16(compute_hash(entries[i].key()), hashPos);
        occupation.set(get_first_chunk16(hashes[i]));
      }

      int i = 0;
      while (i < size) {
        uint8_t hashChunk = get_first_chunk16(hashes[i]);
        int pos = occupation.num_set_until(hashChunk) - 1;

        // if the position is after i the element definitely comes later, so we
        // swap it to that position and proceed without increasing i until
        // eventually an element appears that comes at position i or before
        if (pos > i) {
          std::swap(hashes[pos], hashes[i]);
          std::swap(entries[pos], entries[i]);
          continue;
        }

        // the position is before or at i, now check where the exact location
        // should be for the ordering by hash so that the invariant is that all
        // elements up to i are properly sorted. Essentially insertion sort but
        // with the modification of having a high chance to guess the correct
        // position already using the occupation flags.
        while (pos < i && hashes[pos] >= hashes[i]) ++pos;

        // if the final position is before i we need to move elements to
        // make space at that position, otherwise nothing needs to be done but
        // incrementing i increasing the sorted range by 1.
        if (pos < i) {
          uint64_t hash = hashes[i];
          auto entry = std::move(entries[i]);
          move_backward(pos, i);
          hashes[pos] = hash;
          entries[pos] = std::move(entry);
        }
        ++i;
      }
    }